

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O2

void check_less<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
               (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *a,sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   b)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  string local_1b0 [32];
  ostringstream oss;
  
  bVar1 = booster::operator<(a,&b);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2e);
    std::operator<<(poVar2," a<b");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator<=(a,&b);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2f);
    std::operator<<(poVar2," a<=b");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>(a,&b);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x30);
    std::operator<<(poVar2," !(a>b)");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>=(a,&b);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x31);
    std::operator<<(poVar2," !(a>=b)");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>(&b,a);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    std::operator<<(poVar2," b>a");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator>=(&b,a);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
    std::operator<<(poVar2," b>=a");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator<(&b,a);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x34);
    std::operator<<(poVar2," !(b<a)");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator<=(&b,a);
  if (!bVar1) {
    bVar1 = booster::operator!=(a,&b);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x36);
      std::operator<<(poVar2," a!=b");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,local_1b0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::operator!=(&b,a);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x37);
      std::operator<<(poVar2," b!=a");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,local_1b0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::operator==(a,&b);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x38);
      std::operator<<(poVar2," !(a==b)");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,local_1b0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::operator==(&b,a);
    if (!bVar1) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x39);
    std::operator<<(poVar2," !(b==a)");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
  std::operator<<(poVar2," !(b<=a)");
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,local_1b0);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_less(Match const &a,Other b)
{
	TEST(a<b);
	TEST(a<=b);
	TEST(!(a>b));
	TEST(!(a>=b));
	TEST(b>a);
	TEST(b>=a);
	TEST(!(b<a));
	TEST(!(b<=a));
	TEST(a!=b);
	TEST(b!=a);
	TEST(!(a==b));
	TEST(!(b==a));
}